

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRFunctionPrototype * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRFunctionPrototype>::
allocate<unsigned_int&>(ObjectPool<diligent_spirv_cross::SPIRFunctionPrototype> *this,uint *p)

{
  uint uVar1;
  SPIRFunctionPrototype *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRFunctionPrototype **ppSVar4;
  TypeID local_4c;
  SPIRFunctionPrototype *local_48;
  SPIRFunctionPrototype *ptr;
  uint local_34;
  SPIRFunctionPrototype *pSStack_30;
  uint i;
  SPIRFunctionPrototype *ptr_1;
  uint *puStack_20;
  uint num_objects;
  uint *p_local;
  ObjectPool<diligent_spirv_cross::SPIRFunctionPrototype> *this_local;
  
  puStack_20 = p;
  p_local = (uint *)this;
  bVar2 = VectorView<diligent_spirv_cross::SPIRFunctionPrototype_*>::empty
                    (&(this->vacants).
                      super_VectorView<diligent_spirv_cross::SPIRFunctionPrototype_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<diligent_spirv_cross::SPIRFunctionPrototype,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRFunctionPrototype>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRFunctionPrototype,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRFunctionPrototype>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_30 = (SPIRFunctionPrototype *)malloc((ulong)ptr_1._4_4_ * 0x48);
    if (pSStack_30 == (SPIRFunctionPrototype *)0x0) {
      return (SPIRFunctionPrototype *)0x0;
    }
    SmallVector<diligent_spirv_cross::SPIRFunctionPrototype_*,_0UL>::reserve
              (&this->vacants,(ulong)ptr_1._4_4_);
    for (local_34 = 0; local_34 < ptr_1._4_4_; local_34 = local_34 + 1) {
      ptr = pSStack_30 + local_34;
      SmallVector<diligent_spirv_cross::SPIRFunctionPrototype_*,_0UL>::push_back
                (&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRFunctionPrototype,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRFunctionPrototype>::MallocDeleter>,8ul>
    ::emplace_back<diligent_spirv_cross::SPIRFunctionPrototype*&>
              ((SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRFunctionPrototype,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRFunctionPrototype>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffd0);
  }
  ppSVar4 = VectorView<diligent_spirv_cross::SPIRFunctionPrototype_*>::back
                      (&(this->vacants).
                        super_VectorView<diligent_spirv_cross::SPIRFunctionPrototype_*>);
  local_48 = *ppSVar4;
  SmallVector<diligent_spirv_cross::SPIRFunctionPrototype_*,_0UL>::pop_back(&this->vacants);
  this_00 = local_48;
  TypedID<(diligent_spirv_cross::Types)1>::TypedID(&local_4c,*puStack_20);
  SPIRFunctionPrototype::SPIRFunctionPrototype(this_00,local_4c);
  return local_48;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}